

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

void __thiscall
Inferences::InductionClauseIterator::resolveClauses
          (InductionClauseIterator *this,InductionContext *context,Entry *e,
          TermLiteralClause *bound1,TermLiteralClause *bound2)

{
  TermList arg1;
  int iVar1;
  Stack<std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>_> *this_00;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *ppVar2;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *ppVar3;
  long in_RCX;
  Entry *in_RDX;
  undefined8 in_RSI;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *in_RDI;
  TypedTermList *in_R8;
  Substitution *in_stack_00000058;
  bool in_stack_00000067;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *kv;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *__end1;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *__begin1;
  Stack<std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>_> *__range1;
  bool applySubst;
  TypedTermList rhs_1;
  TypedTermList lhs_1;
  TypedTermList rhs;
  TypedTermList lhs;
  Interpretation in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  Term *in_stack_fffffffffffffee8;
  TypedTermList *in_stack_fffffffffffffef0;
  TermList in_stack_fffffffffffffef8;
  TermList TVar4;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  Literal *in_stack_ffffffffffffff50;
  Clause *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  uint i;
  
  i = (uint)((ulong)in_RSI >> 0x20);
  if ((resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
       ::less == '\0') &&
     (iVar1 = __cxa_guard_acquire(&resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
                                   ::less), iVar1 != 0)) {
    resolveClauses::less =
         Kernel::Signature::getInterpretingSymbol
                   ((Signature *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                    in_stack_fffffffffffffedc);
    __cxa_guard_release(&resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
                         ::less);
  }
  if ((resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
       ::ph == '\0') &&
     (iVar1 = __cxa_guard_acquire(&resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
                                   ::ph), iVar1 != 0)) {
    getPlaceholderForTerm(in_RDI,i);
    Kernel::TypedTermList::TypedTermList(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    __cxa_guard_release(&resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
                         ::ph);
  }
  if (in_RCX != 0) {
    Kernel::Literal::polarity((Literal *)0x7cf288);
    Kernel::Literal::polarity((Literal *)0x7cf2d7);
    in_stack_ffffffffffffff04 = resolveClauses::less;
    Kernel::Literal::polarity((Literal *)0x7cf33f);
    TVar4._content._4_4_ = in_stack_ffffffffffffff04;
    TVar4._content._0_4_ = in_stack_ffffffffffffff00;
    Kernel::Literal::create2
              ((uint)((ulong)in_stack_fffffffffffffef0 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffef0 >> 0x18,0),TVar4,in_stack_fffffffffffffef8);
    InductionContext::insert
              ((InductionContext *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  if (in_R8 != (TypedTermList *)0x0) {
    iVar1 = Kernel::Literal::polarity((Literal *)0x7cf402);
    TVar4._content = (uint64_t)in_R8;
    if (iVar1 != 0) {
      TVar4._content = (uint64_t)&resolveClauses::ph;
    }
    iVar1 = Kernel::Literal::polarity((Literal *)0x7cf44f);
    if (iVar1 == 0) {
      in_R8 = &resolveClauses::ph;
    }
    Kernel::Literal::polarity((Literal *)0x7cf4b9);
    arg1._content._4_4_ = in_stack_ffffffffffffff04;
    arg1._content._0_4_ = in_stack_ffffffffffffff00;
    Kernel::Literal::create2((uint)((ulong)in_R8 >> 0x20),SUB81((ulong)in_R8 >> 0x18,0),arg1,TVar4);
    InductionContext::insert
              ((InductionContext *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  this_00 = Indexing::InductionFormulaIndex::Entry::get(in_RDX);
  ppVar2 = Lib::Stack<std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>_>::begin
                     (this_00);
  ppVar3 = Lib::Stack<std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>_>::end(this_00);
  for (; ppVar2 != ppVar3; ppVar2 = ppVar2 + 1) {
    resolveClauses((InductionClauseIterator *)__range1,&__begin1->first,(InductionContext *)__end1,
                   (Substitution *)kv,in_stack_00000067,in_stack_00000058);
  }
  return;
}

Assistant:

void InductionClauseIterator::resolveClauses(InductionContext context, InductionFormulaIndex::Entry* e, const TermLiteralClause* bound1, const TermLiteralClause* bound2)
{
  static unsigned less = env.signature->getInterpretingSymbol(Theory::INT_LESS);
  ASS_EQ(context._indTerms.size(), 1);
  static TypedTermList ph(getPlaceholderForTerm(context._indTerms,0));
  // lower bound
  if (bound1) {
    auto lhs = bound1->literal->polarity() ? bound1->term : ph;
    auto rhs = bound1->literal->polarity() ? ph : bound1->term;
    context.insert(bound1->clause,
      Literal::create2(less, bound1->literal->polarity(), lhs, rhs));
  }
  // upper bound
  if (bound2) {
    auto lhs = bound2->literal->polarity() ? ph : bound2->term;
    auto rhs = bound2->literal->polarity() ? bound2->term : ph;
    context.insert(bound2->clause,
      Literal::create2(less, bound2->literal->polarity(), lhs, rhs));
  }
  // true if we have a default bound
  bool applySubst = !bound1 && !bound2;
  for (auto& kv : e->get()) {
    resolveClauses(kv.first, context, kv.second, applySubst);
  }
}